

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

R_conflict6 * parse_scope(R_conflict6 *__return_storage_ptr__,QByteArrayView qualifiedKey)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QByteArrayView other;
  QByteArrayView a;
  QByteArrayView qualifiedKey_local;
  
  qualifiedKey_local.m_data = qualifiedKey.m_data;
  qualifiedKey_local.m_size = qualifiedKey.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QByteArrayView::lengthHelperCharArray("QFlags<",8);
  other.m_data = "QFlags<";
  other.m_size = qVar3;
  bVar2 = QByteArrayView::startsWith(&qualifiedKey_local,other);
  if (((bVar2) && (qualifiedKey_local.m_size != 0)) &&
     (qualifiedKey_local.m_data[qualifiedKey_local.m_size + -1] == '>')) {
    qualifiedKey_local.m_size = qualifiedKey_local.m_size + -8;
    qualifiedKey_local.m_data = qualifiedKey_local.m_data + 7;
  }
  a.m_data = "::";
  a.m_size = 2;
  qVar3 = QByteArrayView::lastIndexOf(&qualifiedKey_local,a);
  if (qVar3 < 0) {
    *(undefined4 *)&(__return_storage_ptr__->key).m_size = (undefined4)qualifiedKey_local.m_size;
    *(undefined4 *)((long)&(__return_storage_ptr__->key).m_size + 4) =
         qualifiedKey_local.m_size._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->key).m_data = qualifiedKey_local.m_data._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->key).m_data + 4) =
         qualifiedKey_local.m_data._4_4_;
  }
  else {
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size = qVar3;
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_data =
         qualifiedKey_local.m_data;
    (__return_storage_ptr__->key).m_size = qualifiedKey_local.m_size - (qVar3 + 2);
    (__return_storage_ptr__->key).m_data = qualifiedKey_local.m_data + qVar3 + 2;
  }
  (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
  super__Optional_payload_base<QByteArrayView>._M_engaged = qVar3 >= 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static auto parse_scope(QByteArrayView qualifiedKey) noexcept
{
    struct R {
        std::optional<QByteArrayView> scope;
        QByteArrayView key;
    };
    if (qualifiedKey.startsWith("QFlags<") && qualifiedKey.endsWith('>'))
        qualifiedKey.slice(7, qualifiedKey.length() - 8);
    const auto scopePos = qualifiedKey.lastIndexOf("::"_L1);
    if (scopePos < 0)
        return R{std::nullopt, qualifiedKey};
    else
        return R{qualifiedKey.first(scopePos), qualifiedKey.sliced(scopePos + 2)};
}